

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

bool Cipher::loadFreqMapBinary(char *fname,TFreqMap *freqMap)

{
  mapped_type *pmVar1;
  int i;
  uint uVar2;
  bool bVar3;
  uint8_t d;
  uint8_t n8;
  int local_250;
  mapped_type local_24c;
  TCode curi;
  TProb curp;
  int local_240;
  int local_23c;
  ifstream fin;
  int aiStack_218 [122];
  
  std::ifstream::ifstream(&fin,fname,_S_bin);
  local_240 = *(int *)((long)aiStack_218 + *(long *)(_fin + -0x18));
  if (local_240 == 0) {
    std::istream::read((char *)&fin,(long)freqMap);
    std::istream::read((char *)&fin,(long)&freqMap->nTotal);
    std::istream::read((char *)&fin,(long)&freqMap->pmin);
    std::istream::read((char *)&fin,(long)&local_250);
    for (; 0 < local_250; local_250 = local_250 + -1) {
      std::istream::read((char *)&fin,(long)&curi);
      std::istream::read((char *)&fin,(long)&curp);
      local_24c = curp;
      pmVar1 = std::__detail::
               _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&freqMap->prob,&curi);
      *pmVar1 = local_24c;
      std::istream::read((char *)&fin,(long)&n8);
      if (n8 != '\0') {
        for (uVar2 = 0; uVar2 < n8; uVar2 = uVar2 + 1) {
          std::istream::read((char *)&fin,(long)&d);
          std::istream::read((char *)&fin,(long)&curp);
          local_24c = curp;
          local_23c = (uint)d + curi;
          pmVar1 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&freqMap->prob,&local_23c);
          *pmVar1 = local_24c;
          curi = curi + (uint)d;
        }
        local_250 = local_250 - (uint)n8;
      }
    }
  }
  else {
    printf("    Failed to open file \'%s\'\n",fname);
  }
  bVar3 = local_240 == 0;
  std::ifstream::~ifstream(&fin);
  return bVar3;
}

Assistant:

bool loadFreqMapBinary(const char * fname, TFreqMap & freqMap) {
        std::ifstream fin(fname, std::ios::binary);
        if (fin.good() == false) {
            printf("    Failed to open file '%s'\n", fname);
            return false;
        }

        fin.read((char *) &freqMap.len,    sizeof(freqMap.len));
        fin.read((char *) &freqMap.nTotal, sizeof(freqMap.nTotal));
        fin.read((char *) &freqMap.pmin,   sizeof(freqMap.pmin));

        {
            int32_t n;
            fin.read((char *) &n, sizeof(n));

            TCode curi;
            TProb curp;

            while (n > 0) {
                fin.read((char *) &curi, sizeof(curi));
                fin.read((char *) &curp, sizeof(curp));
                freqMap.prob[curi] = curp;

                uint8_t n8;
                fin.read((char *) &n8, sizeof(n8));

                if (n8 > 0) {
                    for (int i = 0; i < n8; ++i) {
                        uint8_t d;
                        fin.read((char *) &d,    sizeof(d));
                        fin.read((char *) &curp, sizeof(curp));
                        freqMap.prob[curi + d] = curp;
                        curi += d;
                    }

                    n -= n8;
                }

                --n;
            }
        }

        return true;
    }